

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O3

char * OSErrorString(void)

{
  int *piVar1;
  char *__s;
  size_t sVar2;
  size_t sVar3;
  
  piVar1 = __errno_location();
  __s = strerror(*piVar1);
  sVar2 = strlen(__s);
  sVar3 = 0x400;
  if (0x400 < sVar2) {
    sVar3 = sVar2;
  }
  memcpy(ErrorBuf,__s,sVar3 - 1);
  (&DAT_0020268f)[sVar3] = 0;
  return ErrorBuf;
}

Assistant:

const char *OSErrorString()
{
	eoserv_strlcpy(ErrorBuf, strerror(errno), sizeof(ErrorBuf));
	return ErrorBuf;
}